

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O2

char * checkInterfacePropertyCompatibility<char_const*>
                 (cmGeneratorTarget *tgt,string *p,string *config,char *defaultValue,
                 CompatibleType t,char **param_6)

{
  cmGeneratorTarget *this;
  _func_int **__p;
  bool bVar1;
  bool bVar2;
  bool bVar3;
  vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_> *pvVar4;
  string *psVar5;
  char *value;
  ostream *poVar6;
  string *psVar7;
  pointer ppcVar8;
  pair<bool,_const_char_*> pVar9;
  string reportEntry;
  unique_ptr<cmGeneratorExpressionInterpreter,_std::default_delete<cmGeneratorExpressionInterpreter>_>
  genexInterpreter;
  string report;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  propKeys;
  string interfaceProperty;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  headPropKeys;
  ostringstream e;
  bool local_29d;
  char *local_298;
  undefined1 local_288 [32];
  string *local_268;
  _Head_base<0UL,_cmGeneratorExpressionInterpreter_*,_false> local_260;
  cmGeneratorTarget *local_258;
  string local_250;
  string local_230;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_210;
  char *local_1f8;
  pointer local_1f0;
  pointer local_1e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1c0;
  ostream local_1a8;
  
  local_1f8 = defaultValue;
  local_298 = getTypedProperty<char_const*>(tgt,p,(cmGeneratorExpressionInterpreter *)0x0);
  cmGeneratorTarget::GetPropertyKeys_abi_cxx11_(&local_1c0,tgt);
  bVar1 = cm::
          contains<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                    (&local_1c0,p);
  bVar2 = cm::
          contains<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                    (&tgt->LinkImplicitNullProperties,p);
  if (bVar1 && bVar2) {
    __assert_fail("(impliedByUse ^ explicitlySet) || (!impliedByUse && !explicitlySet)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmGeneratorTarget.cxx"
                  ,0x18d2,
                  "PropertyType checkInterfacePropertyCompatibility(const cmGeneratorTarget *, const std::string &, const std::string &, const char *, CompatibleType, PropertyType *) [PropertyType = const char *]"
                 );
  }
  pvVar4 = cmGeneratorTarget::GetLinkImplementationClosure(tgt,config);
  if ((pvVar4->
      super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>).
      _M_impl.super__Vector_impl_data._M_start !=
      (pvVar4->
      super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>).
      _M_impl.super__Vector_impl_data._M_finish) {
    psVar5 = cmGeneratorTarget::GetName_abi_cxx11_(tgt);
    cmStrCat<char_const(&)[12],std::__cxx11::string_const&>
              (&local_250,(char (*) [12])" * Target \"",psVar5);
    if (bVar1) {
      std::__cxx11::string::append((char *)&local_250);
      valueAsString<char_const*>((string *)&local_1a8,local_298);
      std::__cxx11::string::append((string *)&local_250);
      std::__cxx11::string::~string((string *)&local_1a8);
    }
    std::__cxx11::string::append((char *)&local_250);
    std::operator+(&local_1e0,"INTERFACE_",p);
    local_260._M_head_impl = (cmGeneratorExpressionInterpreter *)0x0;
    bVar3 = std::operator==(p,"POSITION_INDEPENDENT_CODE");
    if (bVar3) {
      local_288._0_8_ = tgt->LocalGenerator;
      std::
      make_unique<cmGeneratorExpressionInterpreter,cmLocalGenerator*,std::__cxx11::string_const&,cmGeneratorTarget_const*&>
                ((cmLocalGenerator **)&local_1a8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_288,
                 (cmGeneratorTarget **)config);
      __p = local_1a8._vptr_basic_ostream;
      local_1a8._vptr_basic_ostream = (_func_int **)0x0;
      std::
      __uniq_ptr_impl<cmGeneratorExpressionInterpreter,_std::default_delete<cmGeneratorExpressionInterpreter>_>
      ::reset((__uniq_ptr_impl<cmGeneratorExpressionInterpreter,_std::default_delete<cmGeneratorExpressionInterpreter>_>
               *)&local_260,(pointer)__p);
      std::
      unique_ptr<cmGeneratorExpressionInterpreter,_std::default_delete<cmGeneratorExpressionInterpreter>_>
      ::~unique_ptr((unique_ptr<cmGeneratorExpressionInterpreter,_std::default_delete<cmGeneratorExpressionInterpreter>_>
                     *)&local_1a8);
    }
    ppcVar8 = (pvVar4->
              super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>
              )._M_impl.super__Vector_impl_data._M_start;
    local_1f0 = (pvVar4->
                super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>
                )._M_impl.super__Vector_impl_data._M_finish;
    local_29d = bVar1;
    local_268 = p;
    while( true ) {
      psVar5 = local_268;
      if (ppcVar8 == local_1f0) break;
      this = *ppcVar8;
      local_1e8 = ppcVar8;
      cmGeneratorTarget::GetPropertyKeys_abi_cxx11_(&local_210,this);
      bVar3 = cm::
              contains<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                        (&local_210,&local_1e0);
      value = getTypedProperty<char_const*>(this,&local_1e0,local_260._M_head_impl);
      local_288._0_8_ = local_288 + 0x10;
      local_288._8_8_ = 0;
      local_288[0x10] = '\0';
      if (bVar3) {
        std::__cxx11::string::append(local_288);
        cmGeneratorTarget::GetName_abi_cxx11_(this);
        std::__cxx11::string::append((string *)local_288);
        std::__cxx11::string::append(local_288);
        valueAsString<char_const*>((string *)&local_1a8,value);
        std::__cxx11::string::append((string *)local_288);
        std::__cxx11::string::~string((string *)&local_1a8);
        std::__cxx11::string::append((char *)local_288);
        if (bVar1) {
          local_258 = this;
          pVar9 = consistentProperty<char_const*>(local_298,value,t);
          std::__cxx11::string::append((string *)&local_250);
          compatibilityAgree_abi_cxx11_((string *)&local_1a8,t,local_298 != pVar9.second);
          std::__cxx11::string::append((string *)&local_250);
          std::__cxx11::string::~string((string *)&local_1a8);
          value = pVar9.second;
          if (((undefined1  [16])pVar9 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
            poVar6 = std::operator<<(&local_1a8,"Property ");
            psVar5 = local_268;
            poVar6 = std::operator<<(poVar6,(string *)local_268);
            poVar6 = std::operator<<(poVar6," on target \"");
            psVar7 = cmGeneratorTarget::GetName_abi_cxx11_(tgt);
            poVar6 = std::operator<<(poVar6,(string *)psVar7);
            poVar6 = std::operator<<(poVar6,"\" does\nnot match the INTERFACE_");
            poVar6 = std::operator<<(poVar6,(string *)psVar5);
            poVar6 = std::operator<<(poVar6," property requirement\nof dependency \"");
            psVar7 = cmGeneratorTarget::GetName_abi_cxx11_(local_258);
            poVar6 = std::operator<<(poVar6,(string *)psVar7);
            std::operator<<(poVar6,"\".\n");
            std::__cxx11::stringbuf::str();
            cmSystemTools::Error(&local_230);
LAB_0038d437:
            std::__cxx11::string::~string((string *)&local_230);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
            std::__cxx11::string::~string((string *)local_288);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector(&local_210);
            break;
          }
        }
        else if (bVar2) {
          pVar9 = consistentProperty<char_const*>("",value,t);
          std::__cxx11::string::append((string *)&local_250);
          compatibilityAgree_abi_cxx11_((string *)&local_1a8,t,pVar9.second != "");
          std::__cxx11::string::append((string *)&local_250);
          std::__cxx11::string::~string((string *)&local_1a8);
          value = pVar9.second;
          if (((undefined1  [16])pVar9 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
            poVar6 = std::operator<<(&local_1a8,"Property ");
            psVar5 = local_268;
            local_298 = "";
            poVar6 = std::operator<<(poVar6,(string *)local_268);
            poVar6 = std::operator<<(poVar6," on target \"");
            psVar7 = cmGeneratorTarget::GetName_abi_cxx11_(tgt);
            poVar6 = std::operator<<(poVar6,(string *)psVar7);
            poVar6 = std::operator<<(poVar6,"\" is\nimplied to be ");
            poVar6 = std::operator<<(poVar6,local_1f8);
            poVar6 = std::operator<<(poVar6,
                                     " because it was used to determine the link libraries\nalready. The INTERFACE_"
                                    );
            poVar6 = std::operator<<(poVar6,(string *)psVar5);
            poVar6 = std::operator<<(poVar6," property on\ndependency \"");
            psVar7 = cmGeneratorTarget::GetName_abi_cxx11_(this);
            poVar6 = std::operator<<(poVar6,(string *)psVar7);
            std::operator<<(poVar6,"\" is in conflict.\n");
            std::__cxx11::stringbuf::str();
            cmSystemTools::Error(&local_230);
            goto LAB_0038d437;
          }
        }
        else if (local_29d == false) {
          std::operator+((string *)&local_1a8,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_288,"(Interface set)\n");
          std::__cxx11::string::append((string *)&local_250);
          std::__cxx11::string::~string((string *)&local_1a8);
          local_29d = true;
        }
        else {
          local_258 = this;
          pVar9 = consistentProperty<char_const*>(local_298,value,t);
          std::__cxx11::string::append((string *)&local_250);
          compatibilityAgree_abi_cxx11_((string *)&local_1a8,t,local_298 != pVar9.second);
          std::__cxx11::string::append((string *)&local_250);
          std::__cxx11::string::~string((string *)&local_1a8);
          if (((undefined1  [16])pVar9 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
            poVar6 = std::operator<<(&local_1a8,"The INTERFACE_");
            psVar5 = local_268;
            poVar6 = std::operator<<(poVar6,(string *)local_268);
            poVar6 = std::operator<<(poVar6," property of \"");
            psVar7 = cmGeneratorTarget::GetName_abi_cxx11_(local_258);
            poVar6 = std::operator<<(poVar6,(string *)psVar7);
            poVar6 = std::operator<<(poVar6,"\" does\nnot agree with the value of ");
            poVar6 = std::operator<<(poVar6,(string *)psVar5);
            poVar6 = std::operator<<(poVar6," already determined\nfor \"");
            psVar7 = cmGeneratorTarget::GetName_abi_cxx11_(tgt);
            poVar6 = std::operator<<(poVar6,(string *)psVar7);
            std::operator<<(poVar6,"\".\n");
            std::__cxx11::stringbuf::str();
            cmSystemTools::Error(&local_230);
            goto LAB_0038d437;
          }
          local_29d = true;
          value = pVar9.second;
        }
      }
      else {
        value = local_298;
        if (bVar2) {
          value = "";
        }
        if (bVar1) {
          value = local_298;
        }
      }
      std::__cxx11::string::~string((string *)local_288);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_210);
      ppcVar8 = local_1e8 + 1;
      local_298 = value;
    }
    valueAsString<char_const*>((string *)&local_1a8,local_298);
    compatibilityType_abi_cxx11_((string *)local_288,t);
    cmGeneratorTarget::ReportPropertyOrigin
              (tgt,psVar5,(string *)&local_1a8,&local_250,(string *)local_288);
    std::__cxx11::string::~string((string *)local_288);
    std::__cxx11::string::~string((string *)&local_1a8);
    std::
    unique_ptr<cmGeneratorExpressionInterpreter,_std::default_delete<cmGeneratorExpressionInterpreter>_>
    ::~unique_ptr((unique_ptr<cmGeneratorExpressionInterpreter,_std::default_delete<cmGeneratorExpressionInterpreter>_>
                   *)&local_260);
    std::__cxx11::string::~string((string *)&local_1e0);
    std::__cxx11::string::~string((string *)&local_250);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_1c0);
  return local_298;
}

Assistant:

PropertyType checkInterfacePropertyCompatibility(cmGeneratorTarget const* tgt,
                                                 const std::string& p,
                                                 const std::string& config,
                                                 const char* defaultValue,
                                                 CompatibleType t,
                                                 PropertyType* /*unused*/)
{
  PropertyType propContent = getTypedProperty<PropertyType>(tgt, p);

  std::vector<std::string> headPropKeys = tgt->GetPropertyKeys();
  const bool explicitlySet = cm::contains(headPropKeys, p);

  const bool impliedByUse = tgt->IsNullImpliedByLinkLibraries(p);
  assert((impliedByUse ^ explicitlySet) || (!impliedByUse && !explicitlySet));

  std::vector<cmGeneratorTarget const*> const& deps =
    tgt->GetLinkImplementationClosure(config);

  if (deps.empty()) {
    return propContent;
  }
  bool propInitialized = explicitlySet;

  std::string report = cmStrCat(" * Target \"", tgt->GetName());
  if (explicitlySet) {
    report += "\" has property content \"";
    report += valueAsString<PropertyType>(propContent);
    report += "\"\n";
  } else if (impliedByUse) {
    report += "\" property is implied by use.\n";
  } else {
    report += "\" property not set.\n";
  }

  std::string interfaceProperty = "INTERFACE_" + p;
  std::unique_ptr<cmGeneratorExpressionInterpreter> genexInterpreter;
  if (p == "POSITION_INDEPENDENT_CODE") {
    genexInterpreter = cm::make_unique<cmGeneratorExpressionInterpreter>(
      tgt->GetLocalGenerator(), config, tgt);
  }

  for (cmGeneratorTarget const* theTarget : deps) {
    // An error should be reported if one dependency
    // has INTERFACE_POSITION_INDEPENDENT_CODE ON and the other
    // has INTERFACE_POSITION_INDEPENDENT_CODE OFF, or if the
    // target itself has a POSITION_INDEPENDENT_CODE which disagrees
    // with a dependency.

    std::vector<std::string> propKeys = theTarget->GetPropertyKeys();

    const bool ifaceIsSet = cm::contains(propKeys, interfaceProperty);
    PropertyType ifacePropContent = getTypedProperty<PropertyType>(
      theTarget, interfaceProperty, genexInterpreter.get());

    std::string reportEntry;
    if (ifaceIsSet) {
      reportEntry += " * Target \"";
      reportEntry += theTarget->GetName();
      reportEntry += "\" property value \"";
      reportEntry += valueAsString<PropertyType>(ifacePropContent);
      reportEntry += "\" ";
    }

    if (explicitlySet) {
      if (ifaceIsSet) {
        std::pair<bool, PropertyType> consistent =
          consistentProperty(propContent, ifacePropContent, t);
        report += reportEntry;
        report += compatibilityAgree(t, propContent != consistent.second);
        if (!consistent.first) {
          std::ostringstream e;
          e << "Property " << p << " on target \"" << tgt->GetName()
            << "\" does\nnot match the "
               "INTERFACE_"
            << p
            << " property requirement\nof "
               "dependency \""
            << theTarget->GetName() << "\".\n";
          cmSystemTools::Error(e.str());
          break;
        }
        propContent = consistent.second;
        continue;
      }
      // Explicitly set on target and not set in iface. Can't disagree.
      continue;
    }
    if (impliedByUse) {
      propContent = impliedValue<PropertyType>(propContent);

      if (ifaceIsSet) {
        std::pair<bool, PropertyType> consistent =
          consistentProperty(propContent, ifacePropContent, t);
        report += reportEntry;
        report += compatibilityAgree(t, propContent != consistent.second);
        if (!consistent.first) {
          std::ostringstream e;
          e << "Property " << p << " on target \"" << tgt->GetName()
            << "\" is\nimplied to be " << defaultValue
            << " because it was used to determine the link libraries\n"
               "already. The INTERFACE_"
            << p << " property on\ndependency \"" << theTarget->GetName()
            << "\" is in conflict.\n";
          cmSystemTools::Error(e.str());
          break;
        }
        propContent = consistent.second;
        continue;
      }
      // Implicitly set on target and not set in iface. Can't disagree.
      continue;
    }
    if (ifaceIsSet) {
      if (propInitialized) {
        std::pair<bool, PropertyType> consistent =
          consistentProperty(propContent, ifacePropContent, t);
        report += reportEntry;
        report += compatibilityAgree(t, propContent != consistent.second);
        if (!consistent.first) {
          std::ostringstream e;
          e << "The INTERFACE_" << p << " property of \""
            << theTarget->GetName() << "\" does\nnot agree with the value of "
            << p << " already determined\nfor \"" << tgt->GetName() << "\".\n";
          cmSystemTools::Error(e.str());
          break;
        }
        propContent = consistent.second;
        continue;
      }
      report += reportEntry + "(Interface set)\n";
      propContent = ifacePropContent;
      propInitialized = true;
    } else {
      // Not set. Nothing to agree on.
      continue;
    }
  }

  tgt->ReportPropertyOrigin(p, valueAsString<PropertyType>(propContent),
                            report, compatibilityType(t));
  return propContent;
}